

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::ByteSizeLong
          (TreeEnsembleParameters_TreeNode_EvaluationInfo *this)

{
  int iVar1;
  uint64 uVar2;
  double dVar3;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  TreeEnsembleParameters_TreeNode_EvaluationInfo *this_local;
  
  sStack_18 = 0;
  uVar2 = evaluationindex(this);
  if (uVar2 != 0) {
    uVar2 = evaluationindex(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar2);
    sStack_18 = sStack_18 + 1;
  }
  dVar3 = evaluationvalue(this);
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    sStack_18 = sStack_18 + 9;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar1;
  return sStack_18;
}

Assistant:

size_t TreeEnsembleParameters_TreeNode_EvaluationInfo::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo)
  size_t total_size = 0;

  // uint64 evaluationIndex = 1;
  if (this->evaluationindex() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->evaluationindex());
  }

  // double evaluationValue = 2;
  if (this->evaluationvalue() != 0) {
    total_size += 1 + 8;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}